

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

int Gia_Rsb2ManMffc(Gia_Rsb2Man_t *p,int iNode)

{
  uint uVar1;
  int *pObjs;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  uVar1 = p->nObjs;
  if ((p->vRefs).nCap < (int)uVar1) {
    piVar3 = (p->vRefs).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar3 = (int *)realloc(piVar3,(long)(int)uVar1 << 2);
    }
    (p->vRefs).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRefs).nCap = uVar1;
  }
  piVar3 = (p->vRefs).pArray;
  if (0 < (int)uVar1) {
    memset(piVar3,0,(ulong)uVar1 * 4);
  }
  (p->vRefs).nSize = uVar1;
  pObjs = (p->vObjs).pArray;
  if (pObjs[iNode * 2] == pObjs[iNode * 2 + 1]) {
    __assert_fail("pObjs[2*iNode+0] != pObjs[2*iNode+1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0xf0,"int Gia_Rsb2ManMffc(Gia_Rsb2Man_t *, int)");
  }
  iVar2 = p->iFirstPo;
  if (p->nPis + 1 < iVar2) {
    lVar4 = (long)p->nPis + 1;
    do {
      if (pObjs[lVar4 * 2] < 0) goto LAB_007ac8fd;
      piVar3[(uint)pObjs[lVar4 * 2] >> 1] = piVar3[(uint)pObjs[lVar4 * 2] >> 1] + 1;
      if (pObjs[lVar4 * 2 + 1] < 0) goto LAB_007ac8fd;
      piVar3[(uint)pObjs[lVar4 * 2 + 1] >> 1] = piVar3[(uint)pObjs[lVar4 * 2 + 1] >> 1] + 1;
      lVar4 = lVar4 + 1;
      iVar2 = p->iFirstPo;
    } while (lVar4 < iVar2);
  }
  if (iVar2 < p->nObjs) {
    lVar4 = (long)iVar2;
    do {
      if (pObjs[lVar4 * 2] < 0) goto LAB_007ac8fd;
      piVar3[(uint)pObjs[lVar4 * 2] >> 1] = piVar3[(uint)pObjs[lVar4 * 2] >> 1] + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < p->nObjs);
    iVar2 = p->iFirstPo;
  }
  lVar4 = (long)p->nPis;
  while (lVar4 = lVar4 + 1, lVar4 < iVar2) {
    if (piVar3[lVar4] == 0) {
      __assert_fail("pRefs[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0xf7,"int Gia_Rsb2ManMffc(Gia_Rsb2Man_t *, int)");
    }
  }
  piVar3[iNode] = 0;
  iVar2 = p->iFirstPo;
  if (iNode + 1 < iVar2) {
    lVar4 = (long)(iNode + 1);
    do {
      if (pObjs[lVar4 * 2] < 0) {
LAB_007ac8fd:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (piVar3[(uint)pObjs[lVar4 * 2] >> 1] == 0) {
LAB_007ac8ce:
        piVar3[lVar4] = 0;
        iVar2 = p->iFirstPo;
      }
      else {
        if (pObjs[lVar4 * 2 + 1] < 0) goto LAB_007ac8fd;
        if (piVar3[(uint)pObjs[lVar4 * 2 + 1] >> 1] == 0) goto LAB_007ac8ce;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  iVar2 = Gia_Rsb2ManDeref_rec(p,pObjs,piVar3,iNode);
  return iVar2;
}

Assistant:

int Gia_Rsb2ManMffc( Gia_Rsb2Man_t * p, int iNode )
{
    int i, * pRefs, * pObjs;
    Vec_IntFill( &p->vRefs, p->nObjs, 0 );
    pRefs = Vec_IntArray( &p->vRefs );
    pObjs = Vec_IntArray( &p->vObjs );
    assert( pObjs[2*iNode+0] != pObjs[2*iNode+1] );
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
        pRefs[Abc_Lit2Var(pObjs[2*i+0])]++, 
        pRefs[Abc_Lit2Var(pObjs[2*i+1])]++;
    for ( i = p->iFirstPo; i < p->nObjs; i++ )
        pRefs[Abc_Lit2Var(pObjs[2*i+0])]++;
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
        assert( pRefs[i] );
    pRefs[iNode] = 0;
    for ( i = iNode + 1; i < p->iFirstPo; i++ )
        if ( !pRefs[Abc_Lit2Var(pObjs[2*i+0])] || !pRefs[Abc_Lit2Var(pObjs[2*i+1])] )
            pRefs[i] = 0;
    return Gia_Rsb2ManDeref_rec( p, pObjs, pRefs, iNode );
}